

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O1

void CbInit(N_Vector c,int is,WebData wdata)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  undefined4 in_register_00000034;
  long lVar7;
  sunrealtype gu [6];
  undefined1 local_68 [40];
  undefined8 local_40;
  
  lVar4 = N_VGetArrayPointer();
  uVar1 = *(uint *)(CONCAT44(in_register_00000034,is) + 0x40);
  iVar2 = *(int *)(CONCAT44(in_register_00000034,is) + 0x44);
  if (0 < (int)uVar1) {
    memset(local_68,0,(ulong)uVar1 * 8);
  }
  local_40 = 0x3ff0000000000000;
  iVar3 = 0;
  iVar6 = 1;
  do {
    lVar7 = 0x14;
    iVar5 = iVar6;
    do {
      if (0 < (int)uVar1) {
        memcpy((void *)(lVar4 + -8 + (long)iVar5 * 8),local_68,(ulong)uVar1 * 8);
      }
      iVar5 = iVar5 + uVar1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    iVar3 = iVar3 + 1;
    iVar6 = iVar6 + iVar2;
  } while (iVar3 != 0x14);
  return;
}

Assistant:

static void CbInit(N_Vector c, int is, WebData wdata)
{
  int i, ici, ioff, iyoff, jx, jy, ns, mxns;
  sunrealtype* cdata;

  sunrealtype gu[NS];

  cdata = N_VGetArrayPointer(c);
  ns    = wdata->ns;
  mxns  = wdata->mxns;

  for (i = 1; i <= ns; i++) { gu[i - 1] = ZERO; }
  gu[ISPEC - 1] = ONE;

  for (jy = 0; jy < MY; jy++)
  {
    iyoff = mxns * jy;
    for (jx = 0; jx < MX; jx++)
    {
      ioff = iyoff + ns * jx;
      for (i = 1; i <= ns; i++)
      {
        ici        = ioff + i - 1;
        cdata[ici] = gu[i - 1];
      }
    }
  }
}